

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O1

void __thiscall
BeliefSetNonStationary::BeliefSetNonStationary(BeliefSetNonStationary *this,size_t nrTimeSteps)

{
  undefined8 *puVar1;
  allocator_type local_19;
  
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::vector(&this->_m_beliefSets,nrTimeSteps + 1,&local_19);
  if (nrTimeSteps != 999999) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "BeliefSetNonStationary does not make sense in infinite-horizon setting","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

BeliefSetNonStationary::BeliefSetNonStationary(size_t nrTimeSteps) :
    _m_beliefSets(nrTimeSteps+1)
{
    if(nrTimeSteps==MAXHORIZON)
        throw(E("BeliefSetNonStationary does not make sense in infinite-horizon setting"));
}